

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall
ClipperLib::Clipper::DoBothEdges(Clipper *this,TEdge *edge1,TEdge *edge2,IntPoint *pt)

{
  IntPoint *pt_local;
  TEdge *edge2_local;
  TEdge *edge1_local;
  Clipper *this_local;
  
  AddOutPt(this,edge1,pt);
  AddOutPt(this,edge2,pt);
  SwapSides(edge1,edge2);
  SwapPolyIndexes(edge1,edge2);
  return;
}

Assistant:

void Clipper::DoBothEdges(TEdge *edge1, TEdge *edge2, const IntPoint &pt)
{
  AddOutPt(edge1, pt);
  AddOutPt(edge2, pt);
  SwapSides( *edge1 , *edge2 );
  SwapPolyIndexes( *edge1 , *edge2 );
}